

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t init_WinZip_AES_decryption(archive_read *a)

{
  void *pvVar1;
  int iVar2;
  wchar_t wVar3;
  uint8_t *salt;
  char *pcVar4;
  size_t pw_len;
  char *passphrase;
  wchar_t r;
  wchar_t retry;
  uint8_t derived_key [66];
  size_t salt_len;
  size_t key_len;
  uint8_t *pv;
  void *p;
  zip *zip;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if ((*(char *)((long)pvVar1 + 0x1fe0) == '\0') && (*(char *)((long)pvVar1 + 0x1ff0) == '\0')) {
    iVar2 = *(int *)(*(long *)((long)pvVar1 + 0x70) + 0x88);
    if (iVar2 == 1) {
      stack0xffffffffffffffc0 = 8;
      salt_len = 0x10;
    }
    else if (iVar2 == 2) {
      stack0xffffffffffffffc0 = 0xc;
      salt_len = 0x18;
    }
    else {
      if (iVar2 != 3) {
LAB_009b41ba:
        archive_set_error(&a->archive,0x54,"Corrupted ZIP file data");
        return L'\xffffffe2';
      }
      stack0xffffffffffffffc0 = 0x10;
      salt_len = 0x20;
    }
    salt = (uint8_t *)__archive_read_ahead(a,stack0xffffffffffffffc0 + 2,(ssize_t *)0x0);
    if (salt == (uint8_t *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      passphrase._4_4_ = 0;
      while (pcVar4 = __archive_read_next_passphrase(a), pcVar4 != (char *)0x0) {
        memset(&r,0,0x42);
        pw_len = strlen(pcVar4);
        iVar2 = pbkdf2_sha1(pcVar4,pw_len,salt,stack0xffffffffffffffc0,1000,(uint8_t *)&r,
                            salt_len * 2 + 2);
        if (iVar2 != 0) {
          archive_set_error(&a->archive,-1,"Decryption is unsupported due to lack of crypto library"
                           );
          return L'\xffffffe7';
        }
        if ((*(uint8_t *)((long)&r + salt_len * 2) == salt[stack0xffffffffffffffc0]) &&
           (*(uint8_t *)((long)&r + salt_len * 2 + 1) == (salt + stack0xffffffffffffffc0)[1])) {
          iVar2 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar1 + 0x1f88),(uint8_t *)&r,salt_len)
          ;
          if (iVar2 != 0) {
            archive_set_error(&a->archive,-1,
                              "Decryption is unsupported due to lack of crypto library");
            return L'\xffffffe7';
          }
          iVar2 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar1 + 0x1fe8),
                                   (uint8_t *)((long)&r + salt_len),salt_len);
          if (iVar2 != 0) {
            aes_ctr_release((archive_crypto_ctx *)((long)pvVar1 + 0x1f88));
            archive_set_error(&a->archive,-1,"Failed to initialize HMAC-SHA1");
            return L'\xffffffe7';
          }
          *(undefined1 *)((long)pvVar1 + 0x1ff0) = 1;
          *(undefined1 *)((long)pvVar1 + 0x1fe0) = 1;
          __archive_read_consume(a,stack0xffffffffffffffc0 + 2);
          *(size_t *)((long)pvVar1 + 0x78) =
               *(long *)((long)pvVar1 + 0x78) - (stack0xffffffffffffffc0 + 0xc);
          if (((*(ushort *)(*(long *)((long)pvVar1 + 0x70) + 0x7e) & 8) != 0) ||
             (-1 < *(long *)((long)pvVar1 + 0x78))) {
            *(size_t *)((long)pvVar1 + 0x80) =
                 stack0xffffffffffffffc0 + 0xc + *(long *)((long)pvVar1 + 0x80);
            *(undefined8 *)((long)pvVar1 + 0x1f68) = 0;
            *(undefined1 *)(*(long *)((long)pvVar1 + 0x70) + 0x80) =
                 *(undefined1 *)(*(long *)((long)pvVar1 + 0x70) + 0x8c);
            wVar3 = zip_alloc_decryption_buffer(a);
            return wVar3;
          }
          goto LAB_009b41ba;
        }
        if (10000 < passphrase._4_4_) {
          archive_set_error(&a->archive,-1,"Too many incorrect passphrases");
          return L'\xffffffe7';
        }
        passphrase._4_4_ = passphrase._4_4_ + 1;
      }
      pcVar4 = "Passphrase required for this entry";
      if (0 < passphrase._4_4_) {
        pcVar4 = "Incorrect passphrase";
      }
      archive_set_error(&a->archive,-1,pcVar4);
      a_local._4_4_ = L'\xffffffe7';
    }
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
init_WinZip_AES_decryption(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const void *p;
	const uint8_t *pv;
	size_t key_len, salt_len;
	uint8_t derived_key[MAX_DERIVED_KEY_BUF_SIZE];
	int retry;
	int r;

	if (zip->cctx_valid || zip->hctx_valid)
		return (ARCHIVE_OK);

	switch (zip->entry->aes_extra.strength) {
	case 1: salt_len = 8;  key_len = 16; break;
	case 2: salt_len = 12; key_len = 24; break;
	case 3: salt_len = 16; key_len = 32; break;
	default: goto corrupted;
	}
	p = __archive_read_ahead(a, salt_len + 2, NULL);
	if (p == NULL)
		goto truncated;

	for (retry = 0;; retry++) {
		const char *passphrase;

		passphrase = __archive_read_next_passphrase(a);
		if (passphrase == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    (retry > 0)?
				"Incorrect passphrase":
				"Passphrase required for this entry");
			return (ARCHIVE_FAILED);
		}
		memset(derived_key, 0, sizeof(derived_key));
		r = archive_pbkdf2_sha1(passphrase, strlen(passphrase),
		    p, salt_len, 1000, derived_key, key_len * 2 + 2);
		if (r != 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Decryption is unsupported due to lack of "
			    "crypto library");
			return (ARCHIVE_FAILED);
		}

		/* Check password verification value. */
		pv = ((const uint8_t *)p) + salt_len;
		if (derived_key[key_len * 2] == pv[0] &&
		    derived_key[key_len * 2 + 1] == pv[1])
			break;/* The passphrase is OK. */
		if (retry > 10000) {
			/* Avoid infinity loop. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Too many incorrect passphrases");
			return (ARCHIVE_FAILED);
		}
	}

	r = archive_decrypto_aes_ctr_init(&zip->cctx, derived_key, key_len);
	if (r != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Decryption is unsupported due to lack of crypto library");
		return (ARCHIVE_FAILED);
	}
	r = archive_hmac_sha1_init(&zip->hctx, derived_key + key_len, key_len);
	if (r != 0) {
		archive_decrypto_aes_ctr_release(&zip->cctx);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to initialize HMAC-SHA1");
		return (ARCHIVE_FAILED);
	}
	zip->cctx_valid = zip->hctx_valid = 1;
	__archive_read_consume(a, salt_len + 2);
	zip->entry_bytes_remaining -= salt_len + 2 + AUTH_CODE_SIZE;
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 0)
		goto corrupted;
	zip->entry_compressed_bytes_read += salt_len + 2 + AUTH_CODE_SIZE;
	zip->decrypted_bytes_remaining = 0;

	zip->entry->compression = zip->entry->aes_extra.compression;
	return (zip_alloc_decryption_buffer(a));

truncated:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Truncated ZIP file data");
	return (ARCHIVE_FATAL);
corrupted:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Corrupted ZIP file data");
	return (ARCHIVE_FATAL);
}